

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subject.cpp
# Opt level: O2

void __thiscall Subject::~Subject(Subject *this)

{
  _List_base<Observer_*,_std::allocator<Observer_*>_> *this_00;
  
  this->_vptr_Subject = (_func_int **)&PTR_attach_00121bd8;
  this_00 = &this->listOfObservers->super__List_base<Observer_*,_std::allocator<Observer_*>_>;
  if (this_00 != (_List_base<Observer_*,_std::allocator<Observer_*>_> *)0x0) {
    std::__cxx11::_List_base<Observer_*,_std::allocator<Observer_*>_>::_M_clear(this_00);
  }
  operator_delete(this_00,0x18);
  return;
}

Assistant:

Subject::~Subject() {
delete listOfObservers;
}